

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

bool __thiscall
BattleWithLandlord::LoadCards(BattleWithLandlord *this,string *str1,string *str2,string *last)

{
  bool bVar1;
  reference pcVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  bool valid;
  char x_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  string *__range1_1;
  char x;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  CardStyle *in_stack_00000158;
  string *in_stack_00000160;
  BattleWithLandlord *in_stack_00000168;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff68;
  unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *in_stack_ffffffffffffff70;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  _Base_ptr local_48;
  char local_39;
  undefined8 local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::multiset<char,_std::less<char>,_std::allocator<char>_>::clear
            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11e83a);
  std::multiset<char,_std::less<char>,_std::allocator<char>_>::clear
            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11e84c);
  local_28 = local_10;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38 = std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    local_39 = *pcVar2;
    in_stack_ffffffffffffff78 =
         (multiset<char,_std::less<char>,_std::allocator<char>_> *)(in_RDI + 0x70);
    std::
    unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
    ::operator[](in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
    local_48 = (_Base_ptr)
               std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
                         (in_stack_ffffffffffffff78,(value_type *)in_stack_ffffffffffffff70);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  local_50 = local_18;
  local_58._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_58);
    in_stack_ffffffffffffff70 =
         (unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
          *)(in_RDI + 0xa0);
    std::
    unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
    ::operator[](in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::insert
              (in_stack_ffffffffffffff78,(value_type *)in_stack_ffffffffffffff70);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_58);
  }
  bVar1 = Str2CardStyle(in_stack_00000168,in_stack_00000160,in_stack_00000158);
  *(undefined4 *)(in_RDI + 300) = 0;
  *(undefined4 *)(in_RDI + 0x128) = 0;
  *(undefined1 *)(in_RDI + 0x134) = 1;
  return bVar1;
}

Assistant:

bool BattleWithLandlord::LoadCards(const string &str1, const string &str2, const string &last) {
    _cards[0].clear();
    _cards[1].clear();
    for (auto x: str1) {
        _cards[0].insert(_name2id[x]);
    }
    for (auto x: str2) {
        _cards[1].insert(_name2id[x]);
    }
    
    bool valid = Str2CardStyle(last, _last);

    _round = 0;
    _side = 0;
    _ready = true;
    // PrintCards();
    return valid;
}